

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O0

void __thiscall
plot::BrailleCanvas::BrailleCanvas(BrailleCanvas *this,Size char_sz,TerminalInfo term)

{
  TerminalInfo TVar1;
  BrailleCanvas *this_local;
  Size char_sz_local;
  
  TVar1 = term;
  char_sz_local.x = char_sz.y;
  this_local = (BrailleCanvas *)char_sz.x;
  this->lines_ = char_sz_local.x;
  this->cols_ = (size_t)this_local;
  detail::braille::image_t::image_t(&this->blocks_,char_sz);
  std::forward_list<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
  ::forward_list(&this->stack_);
  std::forward_list<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
  ::forward_list(&this->available_layers_);
  (this->background_).r = term.background_color.r;
  (this->background_).g = term.background_color.g;
  (this->background_).b = term.background_color.b;
  (this->background_).a = term.background_color.a;
  term._32_8_ = TVar1._32_8_;
  *(undefined8 *)&(this->term_).background_color.a = term._32_8_;
  term._0_8_ = TVar1._0_8_;
  term.foreground_color._4_8_ = TVar1.foreground_color._4_8_;
  term._16_8_ = TVar1._16_8_;
  term.background_color._4_8_ = TVar1.background_color._4_8_;
  *(undefined8 *)&(this->term_).foreground_color.a = term._16_8_;
  (this->term_).background_color.g = term.background_color.g;
  (this->term_).background_color.b = term.background_color.b;
  (this->term_).mode = term.mode;
  (this->term_).foreground_color.r = term.foreground_color.r;
  (this->term_).foreground_color.g = term.foreground_color.g;
  (this->term_).foreground_color.b = term.foreground_color.b;
  std::forward_list<plot::detail::braille::image_t,std::allocator<plot::detail::braille::image_t>>::
  emplace_front<plot::GenericPoint<long>&>
            ((forward_list<plot::detail::braille::image_t,std::allocator<plot::detail::braille::image_t>>
              *)&this->available_layers_,(GenericPoint<long> *)&this_local);
  return;
}

Assistant:

BrailleCanvas(Size char_sz, TerminalInfo term = TerminalInfo())
        : lines_(char_sz.y), cols_(char_sz.x), blocks_(char_sz),
          background_(term.background_color), term_(term)
    {
        available_layers_.emplace_front(char_sz);
    }